

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable.c
# Opt level: O0

spki_record * create_record(int ASN,int ski_offset,int spki_offset,rtr_socket *socket)

{
  long lVar1;
  spki_record *__s;
  long in_FS_OFFSET;
  uint local_34;
  uint32_t i;
  spki_record *record;
  rtr_socket *socket_local;
  int spki_offset_local;
  int ski_offset_local;
  int ASN_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __s = (spki_record *)malloc(0x80);
  memset(__s,0,0x80);
  __s->asn = ASN;
  for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
    *(uint *)(__s->ski + (ulong)local_34 * 4) = local_34 + ski_offset;
  }
  for (local_34 = 0; local_34 < 0x16; local_34 = local_34 + 1) {
    *(uint *)(__s->spki + (ulong)local_34 * 4) = local_34 + spki_offset;
  }
  __s->socket = socket;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __s;
  }
  __stack_chk_fail();
}

Assistant:

static struct spki_record *create_record(int ASN, int ski_offset, int spki_offset, struct rtr_socket *socket)
{
	struct spki_record *record = malloc(sizeof(struct spki_record));
	uint32_t i;

	memset(record, 0, sizeof(*record));
	record->asn = ASN;

	for (i = 0; i < sizeof(record->ski) / sizeof(uint32_t); i++)
		((uint32_t *)record->ski)[i] = i + ski_offset;

	for (i = 0; i < sizeof(record->spki) / sizeof(uint32_t); i++)
		((uint32_t *)record->spki)[i] = i + spki_offset;

	record->socket = socket;
	return record;
}